

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

uint8 * __thiscall
caffe::BlobProto::InternalSerializeWithCachedSizesToArray
          (BlobProto *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  int32 iVar2;
  int iVar3;
  uint8 *puVar4;
  UnknownFieldSet *unknown_fields;
  uint8 *puStack_40;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  BlobProto *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  puStack_40 = target;
  if ((uVar1 & 2) != 0) {
    iVar2 = num(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1,iVar2,target);
  }
  if ((uVar1 & 4) != 0) {
    iVar2 = channels(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2,iVar2,puStack_40);
  }
  if ((uVar1 & 8) != 0) {
    iVar2 = height(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3,iVar2,puStack_40);
  }
  if ((uVar1 & 0x10) != 0) {
    iVar2 = width(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(4,iVar2,puStack_40);
  }
  iVar3 = data_size(this);
  if (0 < iVar3) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteTagToArray
                       (5,WIRETYPE_LENGTH_DELIMITED,puStack_40);
    puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                       (this->_data_cached_byte_size_,puVar4);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteFloatNoTagToArray
                           (&this->data_,puVar4);
  }
  iVar3 = diff_size(this);
  if (0 < iVar3) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteTagToArray
                       (6,WIRETYPE_LENGTH_DELIMITED,puStack_40);
    puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                       (this->_diff_cached_byte_size_,puVar4);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteFloatNoTagToArray
                           (&this->diff_,puVar4);
  }
  if ((uVar1 & 1) != 0) {
    puStack_40 = google::protobuf::internal::WireFormatLite::
                 InternalWriteMessageNoVirtualToArray<caffe::BlobShape>
                           (7,this->shape_,deterministic,puStack_40);
  }
  iVar3 = double_data_size(this);
  if (0 < iVar3) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteTagToArray
                       (8,WIRETYPE_LENGTH_DELIMITED,puStack_40);
    puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                       (this->_double_data_cached_byte_size_,puVar4);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteDoubleNoTagToArray
                           (&this->double_data_,puVar4);
  }
  iVar3 = double_diff_size(this);
  if (0 < iVar3) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteTagToArray
                       (9,WIRETYPE_LENGTH_DELIMITED,puStack_40);
    puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                       (this->_double_diff_cached_byte_size_,puVar4);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteDoubleNoTagToArray
                           (&this->double_diff_,puVar4);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = BlobProto::unknown_fields(this);
    puStack_40 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                           (unknown_fields,puStack_40);
  }
  return puStack_40;
}

Assistant:

::google::protobuf::uint8* BlobProto::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.BlobProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 num = 1 [default = 0];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1, this->num(), target);
  }

  // optional int32 channels = 2 [default = 0];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->channels(), target);
  }

  // optional int32 height = 3 [default = 0];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3, this->height(), target);
  }

  // optional int32 width = 4 [default = 0];
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(4, this->width(), target);
  }

  // repeated float data = 5 [packed = true];
  if (this->data_size() > 0) {
    target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(
      5,
      ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
      target);
    target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(
      _data_cached_byte_size_, target);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteFloatNoTagToArray(this->data_, target);
  }

  // repeated float diff = 6 [packed = true];
  if (this->diff_size() > 0) {
    target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(
      6,
      ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
      target);
    target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(
      _diff_cached_byte_size_, target);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteFloatNoTagToArray(this->diff_, target);
  }

  // optional .caffe.BlobShape shape = 7;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        7, *this->shape_, deterministic, target);
  }

  // repeated double double_data = 8 [packed = true];
  if (this->double_data_size() > 0) {
    target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(
      8,
      ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
      target);
    target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(
      _double_data_cached_byte_size_, target);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteDoubleNoTagToArray(this->double_data_, target);
  }

  // repeated double double_diff = 9 [packed = true];
  if (this->double_diff_size() > 0) {
    target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(
      9,
      ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
      target);
    target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(
      _double_diff_cached_byte_size_, target);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteDoubleNoTagToArray(this->double_diff_, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.BlobProto)
  return target;
}